

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
          (View<float,false,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end)

{
  pointer data;
  long lVar1;
  runtime_error *this_00;
  unsigned_long *puVar2;
  allocator_type local_29;
  
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] == (View<float,false,std::allocator<unsigned_long>>)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    lVar1 = 1;
    puVar2 = begin;
    if (begin != end) {
      do {
        lVar1 = lVar1 * *puVar2;
        puVar2 = puVar2 + 1;
      } while (puVar2 != end);
    }
    if (lVar1 == *(long *)(this + 0x30)) {
      data = *(pointer *)this;
      View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
      View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
      assign<unsigned_long*>
                (this,begin,end,data,(CoordinateOrder *)(this + 0x38),
                 (CoordinateOrder *)(this + 0x38),&local_29);
      View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
View<T, isConst, A>::reshape
(
    ShapeIterator begin,
    ShapeIterator end
)
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || isSimple());
    if(!MARRAY_NO_ARG_TEST) {
        std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
            std::multiplies<std::size_t>());
        marray_detail::Assert(size == this->size());
    }
    assign(begin, end, data_, coordinateOrder(), coordinateOrder());
    testInvariant();
}